

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::LayerNormalizationLayerParams::Clear(LayerNormalizationLayerParams *this)

{
  Arena *pAVar1;
  LayerNormalizationLayerParams *this_local;
  
  google::protobuf::RepeatedField<long>::Clear(&this->normalizedshape_);
  pAVar1 = GetArenaNoVirtual(this);
  if (((pAVar1 == (Arena *)0x0) && (this->gamma_ != (WeightParams *)0x0)) &&
     (this->gamma_ != (WeightParams *)0x0)) {
    (*(this->gamma_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->gamma_ = (WeightParams *)0x0;
  pAVar1 = GetArenaNoVirtual(this);
  if (((pAVar1 == (Arena *)0x0) && (this->beta_ != (WeightParams *)0x0)) &&
     (this->beta_ != (WeightParams *)0x0)) {
    (*(this->beta_->super_MessageLite)._vptr_MessageLite[1])();
  }
  this->beta_ = (WeightParams *)0x0;
  this->eps_ = 0.0;
  return;
}

Assistant:

void LayerNormalizationLayerParams::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.LayerNormalizationLayerParams)
  normalizedshape_.Clear();
  if (GetArenaNoVirtual() == NULL && gamma_ != NULL) {
    delete gamma_;
  }
  gamma_ = NULL;
  if (GetArenaNoVirtual() == NULL && beta_ != NULL) {
    delete beta_;
  }
  beta_ = NULL;
  eps_ = 0;
}